

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O1

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int _h;
  void *pvVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  undefined4 unaff_EBP;
  uint uVar10;
  long lVar11;
  int iVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  Mat local_88;
  Option *local_40;
  int local_34;
  
  uVar1 = bottom_blob->dims;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    auVar19._0_4_ = -(uint)(this->expand_w == 0);
    auVar19._4_4_ = -(uint)(this->expand_h == 0);
    auVar19._8_4_ = -(uint)(this->expand_d == 0);
    auVar19._12_4_ = -(uint)(this->expand_c == 0);
    uVar10 = movmskps(unaff_EBP,auVar19);
    uVar10 = uVar10 ^ 0xf;
    bVar17 = (byte)uVar10;
    bVar18 = (bVar17 & 2) >> 1;
    bVar15 = (bVar17 & 4) >> 2;
    bVar17 = bVar17 >> 3;
  }
  else {
    lVar8 = (long)(this->axes).w;
    if (lVar8 < 1) {
      uVar10 = 0;
      bVar18 = 0;
      bVar15 = 0;
      bVar17 = 0;
    }
    else {
      lVar11 = 0;
      bVar15 = 0;
      bVar18 = 0;
      uVar10 = 0;
      bVar16 = 0;
      do {
        iVar12 = *(int *)((long)pvVar2 + lVar11 * 4);
        iVar12 = (iVar12 >> 0x1f & uVar1 + 1) + iVar12;
        bVar17 = bVar18;
        if (iVar12 == 0) {
          bVar17 = 1;
        }
        if (uVar1 != 1) {
          bVar17 = bVar18;
        }
        uVar4 = uVar10;
        bVar14 = bVar15;
        bVar13 = bVar17;
        if (iVar12 == 1) {
          bVar14 = 1;
          bVar13 = 1;
          uVar4 = 1;
        }
        if (uVar1 != 1) {
          uVar4 = uVar10;
        }
        if (uVar1 != 2) {
          bVar13 = bVar17;
        }
        uVar9 = uVar4;
        bVar18 = bVar13;
        if (iVar12 == 2) {
          bVar18 = 1;
          uVar9 = 1;
        }
        if (uVar1 != 2) {
          uVar9 = uVar4;
        }
        bVar17 = bVar16;
        if (iVar12 == 0) {
          bVar17 = 1;
        }
        if ((uVar1 & 0xfffffffe) != 2) {
          bVar17 = bVar16;
        }
        uVar10 = uVar9;
        if (iVar12 == 3) {
          uVar10 = 1;
        }
        if (uVar1 != 3) {
          uVar10 = uVar9;
          bVar14 = bVar15;
          bVar18 = bVar13;
        }
        bVar15 = bVar14;
        lVar11 = lVar11 + 1;
        bVar16 = bVar17;
      } while (lVar8 != lVar11);
    }
  }
  iVar12 = bottom_blob->w;
  _h = bottom_blob->h;
  local_34 = bottom_blob->c;
  local_40 = opt;
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar5 = bottom_blob->w;
    iVar6 = bottom_blob->h;
    iVar7 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar5;
    top_blob->h = iVar6;
    top_blob->d = iVar7;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (uVar1 != 3) {
    if (uVar1 != 2) {
      if (uVar1 != 1) goto LAB_00431b29;
      if (((byte)uVar10 & bVar18) == 0) {
        if ((uVar10 & 1) == 0) {
          if (bVar18 == 0) goto LAB_00431b29;
          Mat::reshape(&local_88,bottom_blob,iVar12,1,local_40->blob_allocator);
          if (&local_88 != top_blob) {
            if (local_88.refcount != (int *)0x0) {
              LOCK();
              *local_88.refcount = *local_88.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_88.data;
            top_blob->refcount = local_88.refcount;
            top_blob->elemsize = local_88.elemsize;
            top_blob->elempack = local_88.elempack;
            top_blob->allocator = local_88.allocator;
            top_blob->dims = local_88.dims;
            top_blob->w = local_88.w;
            top_blob->h = local_88.h;
            top_blob->d = local_88.d;
            top_blob->c = local_88.c;
            top_blob->cstep = local_88.cstep;
          }
          if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
          LOCK();
          *local_88.refcount = *local_88.refcount + -1;
          UNLOCK();
          if (*local_88.refcount != 0) goto LAB_00431b29;
          if (local_88.allocator != (Allocator *)0x0) {
            (*(local_88.allocator)->_vptr_Allocator[3])();
            goto LAB_00431b29;
          }
        }
        else {
          Mat::reshape(&local_88,bottom_blob,1,iVar12,local_40->blob_allocator);
          if (&local_88 != top_blob) {
            if (local_88.refcount != (int *)0x0) {
              LOCK();
              *local_88.refcount = *local_88.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_88.data;
            top_blob->refcount = local_88.refcount;
            top_blob->elemsize = local_88.elemsize;
            top_blob->elempack = local_88.elempack;
            top_blob->allocator = local_88.allocator;
            top_blob->dims = local_88.dims;
            top_blob->w = local_88.w;
            top_blob->h = local_88.h;
            top_blob->d = local_88.d;
            top_blob->c = local_88.c;
            top_blob->cstep = local_88.cstep;
          }
          if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
          LOCK();
          *local_88.refcount = *local_88.refcount + -1;
          UNLOCK();
          if (*local_88.refcount != 0) goto LAB_00431b29;
          if (local_88.allocator != (Allocator *)0x0) {
            (*(local_88.allocator)->_vptr_Allocator[3])();
            goto LAB_00431b29;
          }
        }
      }
      else {
        Mat::reshape(&local_88,bottom_blob,1,iVar12,1,local_40->blob_allocator);
        if (&local_88 != top_blob) {
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_88.data;
          top_blob->refcount = local_88.refcount;
          top_blob->elemsize = local_88.elemsize;
          top_blob->elempack = local_88.elempack;
          top_blob->allocator = local_88.allocator;
          top_blob->dims = local_88.dims;
          top_blob->w = local_88.w;
          top_blob->h = local_88.h;
          top_blob->d = local_88.d;
          top_blob->c = local_88.c;
          top_blob->cstep = local_88.cstep;
        }
        if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount != 0) goto LAB_00431b29;
        if (local_88.allocator != (Allocator *)0x0) {
          (*(local_88.allocator)->_vptr_Allocator[3])();
          goto LAB_00431b29;
        }
      }
      if (local_88.data != (void *)0x0) {
        free(local_88.data);
      }
      goto LAB_00431b29;
    }
    if ((uVar10 & 1) == 0) {
      if (bVar18 == 0) {
        if ((bVar17 & 1) == 0) goto LAB_00431b29;
        Mat::reshape(&local_88,bottom_blob,iVar12,_h,1,local_40->blob_allocator);
        if (&local_88 != top_blob) {
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_88.data;
          top_blob->refcount = local_88.refcount;
          top_blob->elemsize = local_88.elemsize;
          top_blob->elempack = local_88.elempack;
          top_blob->allocator = local_88.allocator;
          top_blob->dims = local_88.dims;
          top_blob->w = local_88.w;
          top_blob->h = local_88.h;
          top_blob->d = local_88.d;
          top_blob->c = local_88.c;
          top_blob->cstep = local_88.cstep;
        }
        if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount != 0) goto LAB_00431b29;
        if (local_88.allocator != (Allocator *)0x0) {
          (*(local_88.allocator)->_vptr_Allocator[3])();
          goto LAB_00431b29;
        }
      }
      else {
        Mat::reshape(&local_88,bottom_blob,iVar12,1,_h,local_40->blob_allocator);
        if (&local_88 != top_blob) {
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_88.data;
          top_blob->refcount = local_88.refcount;
          top_blob->elemsize = local_88.elemsize;
          top_blob->elempack = local_88.elempack;
          top_blob->allocator = local_88.allocator;
          top_blob->dims = local_88.dims;
          top_blob->w = local_88.w;
          top_blob->h = local_88.h;
          top_blob->d = local_88.d;
          top_blob->c = local_88.c;
          top_blob->cstep = local_88.cstep;
        }
        if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount != 0) goto LAB_00431b29;
        if (local_88.allocator != (Allocator *)0x0) {
          (*(local_88.allocator)->_vptr_Allocator[3])();
          goto LAB_00431b29;
        }
      }
    }
    else {
      Mat::reshape(&local_88,bottom_blob,1,iVar12,_h,local_40->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_00431b29;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_00431b29;
      }
    }
    if (local_88.data != (void *)0x0) {
      free(local_88.data);
    }
    goto LAB_00431b29;
  }
  if ((uVar10 & 1) == 0) {
    if (bVar18 == 0) {
      if (bVar15 == 0) {
        if ((bVar17 & 1) == 0) goto LAB_00431b29;
        Mat::reshape(&local_88,bottom_blob,iVar12,_h,local_34,1,local_40->blob_allocator);
        if (&local_88 != top_blob) {
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_88.data;
          top_blob->refcount = local_88.refcount;
          top_blob->elemsize = local_88.elemsize;
          top_blob->elempack = local_88.elempack;
          top_blob->allocator = local_88.allocator;
          top_blob->dims = local_88.dims;
          top_blob->w = local_88.w;
          top_blob->h = local_88.h;
          top_blob->d = local_88.d;
          top_blob->c = local_88.c;
          top_blob->cstep = local_88.cstep;
        }
        if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount != 0) goto LAB_00431b29;
        if (local_88.allocator != (Allocator *)0x0) {
          (*(local_88.allocator)->_vptr_Allocator[3])();
          goto LAB_00431b29;
        }
      }
      else {
        Mat::reshape(&local_88,bottom_blob,iVar12,_h,1,local_34,local_40->blob_allocator);
        if (&local_88 != top_blob) {
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_88.data;
          top_blob->refcount = local_88.refcount;
          top_blob->elemsize = local_88.elemsize;
          top_blob->elempack = local_88.elempack;
          top_blob->allocator = local_88.allocator;
          top_blob->dims = local_88.dims;
          top_blob->w = local_88.w;
          top_blob->h = local_88.h;
          top_blob->d = local_88.d;
          top_blob->c = local_88.c;
          top_blob->cstep = local_88.cstep;
        }
        if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount != 0) goto LAB_00431b29;
        if (local_88.allocator != (Allocator *)0x0) {
          (*(local_88.allocator)->_vptr_Allocator[3])();
          goto LAB_00431b29;
        }
      }
    }
    else {
      Mat::reshape(&local_88,bottom_blob,iVar12,1,_h,local_34,local_40->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_00431b29;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_00431b29;
      }
    }
  }
  else {
    Mat::reshape(&local_88,bottom_blob,1,iVar12,_h,local_34,local_40->blob_allocator);
    if (&local_88 != top_blob) {
      if (local_88.refcount != (int *)0x0) {
        LOCK();
        *local_88.refcount = *local_88.refcount + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_88.data;
      top_blob->refcount = local_88.refcount;
      top_blob->elemsize = local_88.elemsize;
      top_blob->elempack = local_88.elempack;
      top_blob->allocator = local_88.allocator;
      top_blob->dims = local_88.dims;
      top_blob->w = local_88.w;
      top_blob->h = local_88.h;
      top_blob->d = local_88.d;
      top_blob->c = local_88.c;
      top_blob->cstep = local_88.cstep;
    }
    if (local_88.refcount == (int *)0x0) goto LAB_00431b29;
    LOCK();
    *local_88.refcount = *local_88.refcount + -1;
    UNLOCK();
    if (*local_88.refcount != 0) goto LAB_00431b29;
    if (local_88.allocator != (Allocator *)0x0) {
      (*(local_88.allocator)->_vptr_Allocator[3])();
      goto LAB_00431b29;
    }
  }
  if (local_88.data != (void *)0x0) {
    free(local_88.data);
  }
LAB_00431b29:
  if (top_blob->data == (void *)0x0) {
    iVar12 = -100;
  }
  else {
    iVar12 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar12 = 0;
    }
  }
  return iVar12;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_d = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_d = expand_d;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
            if (dims == 3 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 3 && axis == 1)
            {
                _expand_d = true;
            }
            if (dims == 3 && axis == 2)
            {
                _expand_h = true;
            }
            if (dims == 3 && axis == 3)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, channels, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, channels, opt.blob_allocator);
        }
        else if (_expand_d)
        {
            top_blob = bottom_blob.reshape(w, h, 1, channels, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, channels, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}